

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_ModuleCloner.h
# Opt level: O3

int __thiscall
soul::ModuleCloner::clone
          (ModuleCloner *this,__fn *__fn,void *__child_stack,int __flags,void *__arg,...)

{
  uint uVar1;
  uint uVar2;
  int *piVar3;
  SourceCodeText *o;
  Structure *o_00;
  long lVar4;
  long lVar5;
  undefined8 *puVar6;
  Structure *oldObject;
  Identifier IVar7;
  Variable *pVVar8;
  long lVar9;
  ulong uVar10;
  pool_ref<soul::heart::Block> *b;
  undefined8 *puVar11;
  ulong uVar12;
  long lVar13;
  bool bVar14;
  string_view newString;
  Block *local_48 [2];
  StructurePtr local_38;
  
  std::
  _Hashtable<soul::pool_ref<const_soul::heart::Block>,_std::pair<const_soul::pool_ref<const_soul::heart::Block>,_soul::pool_ptr<soul::heart::Block>_>,_std::allocator<std::pair<const_soul::pool_ref<const_soul::heart::Block>,_soul::pool_ptr<soul::heart::Block>_>_>,_std::__detail::_Select1st,_std::equal_to<soul::pool_ref<const_soul::heart::Block>_>,_std::hash<soul::pool_ref<const_soul::heart::Block>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  ::clear(&(this->blockMappings)._M_h);
  piVar3 = *(int **)((long)__child_stack + 8);
  if (piVar3 != (int *)0x0) {
    *piVar3 = *piVar3 + 1;
  }
  o = *(SourceCodeText **)(__fn + 8);
  *(int **)(__fn + 8) = piVar3;
  RefCountedPtr<soul::SourceCodeText>::decIfNotNull(o);
  *(undefined8 *)(__fn + 0x10) = *(undefined8 *)((long)__child_stack + 0x10);
  cloneType((Type *)local_48,this->structMappings,(Type *)((long)__child_stack + 0x18));
  *(Block **)(__fn + 0x18) = local_48[0];
  *(Block **)(__fn + 0x20) = local_48[1];
  o_00 = *(Structure **)(__fn + 0x28);
  if (local_38.object != o_00) {
    *(Structure **)(__fn + 0x28) = local_38.object;
    local_38.object = (Structure *)0x0;
    RefCountedPtr<soul::Structure>::decIfNotNull(o_00);
  }
  RefCountedPtr<soul::Structure>::decIfNotNull(local_38.object);
  puVar11 = *(undefined8 **)((long)__child_stack + 0x30);
  if (puVar11 == (undefined8 *)0x0) {
    IVar7.name = (string *)0x0;
  }
  else {
    newString._M_str = (char *)*puVar11;
    newString._M_len = puVar11[1];
    IVar7 = Identifier::Pool::get(&this->newModule->allocator->identifiers,newString);
  }
  *(string **)(__fn + 0x30) = IVar7.name;
  uVar1 = *(uint *)((long)__child_stack + 0xd0);
  uVar2 = *(uint *)(__fn + 0xd0);
  if (uVar2 != uVar1) {
    bVar14 = uVar2 == 0;
    uVar2 = CONCAT31((int3)(uVar2 >> 8),bVar14);
    if (uVar1 != 0 && !bVar14) {
      throwInternalCompilerError("isNormal() || newType.isNormal()","operator=",0x34f);
    }
    *(uint *)(__fn + 0xd0) = uVar1;
  }
  uVar10 = (ulong)uVar2;
  *(undefined4 *)(__fn + 0xb8) = *(undefined4 *)((long)__child_stack + 0xb8);
  __fn[0xd4] = *(code *)((long)__child_stack + 0xd4);
  __fn[0xd5] = *(code *)((long)__child_stack + 0xd5);
  Annotation::operator=((Annotation *)(__fn + 0x88),(Annotation *)((long)__child_stack + 0x88));
  lVar9 = *(long *)((long)__child_stack + 0x40);
  if (lVar9 != 0) {
    lVar4 = *(long *)((long)__child_stack + 0x38);
    lVar13 = 0;
    do {
      pVVar8 = cloneVariable(this,*(Variable **)(lVar4 + lVar13));
      ArrayWithPreallocation<soul::pool_ref<soul::heart::Variable>,_4UL>::reserve
                ((ArrayWithPreallocation<soul::pool_ref<soul::heart::Variable>,_4UL> *)(__fn + 0x38)
                 ,*(long *)(__fn + 0x40) + 1);
      lVar5 = *(long *)(__fn + 0x40);
      *(Variable **)(*(long *)(__fn + 0x38) + lVar5 * 8) = pVVar8;
      uVar10 = lVar5 + 1;
      *(ulong *)(__fn + 0x40) = uVar10;
      lVar13 = lVar13 + 8;
    } while (lVar9 << 3 != lVar13);
  }
  puVar11 = *(undefined8 **)((long)__child_stack + 0x70);
  puVar6 = *(undefined8 **)((long)__child_stack + 0x78);
  if (puVar11 != puVar6) {
    do {
      local_48[0] = createNewBlock(this,(Block *)*puVar11);
      std::
      vector<soul::pool_ref<soul::heart::Block>,std::allocator<soul::pool_ref<soul::heart::Block>>>
      ::emplace_back<soul::pool_ref<soul::heart::Block>>
                ((vector<soul::pool_ref<soul::heart::Block>,std::allocator<soul::pool_ref<soul::heart::Block>>>
                  *)(__fn + 0x70),(pool_ref<soul::heart::Block> *)local_48);
      puVar11 = puVar11 + 1;
    } while (puVar11 != puVar6);
  }
  lVar9 = *(long *)(__fn + 0x70);
  if (*(long *)(__fn + 0x78) != lVar9) {
    uVar12 = 0;
    do {
      clone(this,*(__fn **)(lVar9 + uVar12 * 8),
            *(void **)(*(long *)((long)__child_stack + 0x70) + uVar12 * 8),(int)uVar10,__arg);
      uVar12 = uVar12 + 1;
      lVar9 = *(long *)(__fn + 0x70);
      uVar10 = *(long *)(__fn + 0x78) - lVar9 >> 3;
    } while (uVar12 < uVar10);
  }
  return (int)lVar9;
}

Assistant:

void clone (heart::Function& f, const heart::Function& old)
    {
        blockMappings.clear();

        f.location = old.location;
        f.returnType = cloneType (old.returnType);
        f.name = newModule.allocator.get (old.name);
        f.functionType = old.functionType;
        f.intrinsicType = old.intrinsicType;
        f.isExported = old.isExported;
        f.hasNoBody = old.hasNoBody;
        f.annotation = old.annotation;

        for (auto& p : old.parameters)
            f.parameters.push_back (cloneVariable (p));

        for (auto& b : old.blocks)
            f.blocks.push_back (createNewBlock (b));

        for (size_t i = 0; i < f.blocks.size(); ++i)
            clone (f.blocks[i], old.blocks[i]);
    }